

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_ops_test.cc
# Opt level: O0

void batchCopy(Qiniu_Client *client,Qiniu_RS_EntryPathPair *entryPairs,Qiniu_ItemCount entryCount)

{
  bool bVar1;
  uint uVar2;
  Qiniu_RS_BatchItemRet *rets_00;
  char *pcVar3;
  Qiniu_Error QVar4;
  AssertHelper local_98;
  Message local_90;
  undefined8 local_88;
  char *pcStack_80;
  AssertHelper local_78;
  Message local_70 [3];
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  int curr;
  Qiniu_Error err;
  Qiniu_RS_BatchItemRet *rets;
  Qiniu_ItemCount entryCount_local;
  Qiniu_RS_EntryPathPair *entryPairs_local;
  Qiniu_Client *client_local;
  
  rets_00 = (Qiniu_RS_BatchItemRet *)calloc((long)entryCount,0x10);
  QVar4 = Qiniu_RS_BatchCopy(client,rets_00,entryPairs,entryCount);
  uVar2 = QVar4.code;
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ < entryCount;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    Qiniu_Stderr_Debug("code: %d",
                       (ulong)(uint)rets_00[gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_].code);
    if (rets_00[gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_].code != 200) {
      Qiniu_Stderr_Error("error: %s",
                         rets_00[gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_].error);
    }
    pcVar3 = Qiniu_Buffer_CStr(&client->respHeader);
    Qiniu_Stderr_Debug("%s",pcVar3);
    local_54 = 200;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_50,"rets[curr].code","200",
               &rets_00[gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_].code,&local_54);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      testing::Message::Message(local_70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/rs_ops_test.cc"
                 ,0x22,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message(local_70);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  }
  free(rets_00);
  if (uVar2 != 200) {
    local_88 = CONCAT44(curr,uVar2);
    QVar4._4_4_ = 0;
    QVar4.code = uVar2;
    pcStack_80 = QVar4.message;
    debug(client,QVar4);
    testing::Message::Message(&local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/rs_ops_test.cc"
               ,0x2a,"Failed");
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  return;
}

Assistant:

static void batchCopy(Qiniu_Client *client,
					  Qiniu_RS_EntryPathPair *entryPairs, Qiniu_ItemCount entryCount)
{
	Qiniu_RS_BatchItemRet *rets = (Qiniu_RS_BatchItemRet *)calloc(entryCount, sizeof(Qiniu_RS_BatchItemRet));
	Qiniu_Error err = Qiniu_RS_BatchCopy(client, rets, entryPairs, entryCount);
	int curr = 0;

	while (curr < entryCount)
	{
		Qiniu_Log_Debug("code: %d", rets[curr].code);

		if (rets[curr].code != 200)
		{
			Qiniu_Log_Error("error: %s", rets[curr].error);
		}
		Qiniu_Log_Debug("%s", Qiniu_Buffer_CStr(&client->respHeader));
		EXPECT_EQ(rets[curr].code, 200);
		curr++;
	}
	free(rets);

	if (err.code != 200)
	{
		debug(client, err);
		FAIL();
		return;
	}
}